

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall psy::C::Parser::parseAlignmentSpecifier_AtFirst(Parser *this,SpecifierSyntax **spec)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  AlignmentSpecifierSyntax *pAVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == KeywordAlias___alignas) {
    pAVar3 = makeNode<psy::C::AlignmentSpecifierSyntax>(this);
    *spec = &pAVar3->super_SpecifierSyntax;
    IVar4 = consume(this);
    pAVar3->alignasKwTkIdx_ = IVar4;
    bVar1 = parseParenthesizedTypeNameOrExpression(this,&pAVar3->tyRef_);
    return bVar1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x596);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,"assert failure: `_Alignas\'");
  std::endl<char,std::char_traits<char>>(poVar5);
  return false;
}

Assistant:

bool Parser::parseAlignmentSpecifier_AtFirst(SpecifierSyntax*& spec)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword__Alignas,
                  return false,
                  "assert failure: `_Alignas'");

    auto alignSpec = makeNode<AlignmentSpecifierSyntax>();
    spec = alignSpec;
    alignSpec->alignasKwTkIdx_ = consume();
    return parseParenthesizedTypeNameOrExpression(alignSpec->tyRef_);
}